

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O0

Atomic * rw::Atomic::create(void)

{
  FILE *__stream;
  char *pcVar1;
  EVP_PKEY_CTX *ctx;
  Error local_20;
  Error _e;
  Atomic *atomic;
  
  _e = (Error)malloc_LOC((long)(int)s_plglist,0x30014,
                         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp line: 414"
                        );
  if (_e == (Error)0x0) {
    local_20.plugin = 2;
    local_20.code = 0x80000002;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/clump.cpp"
            ,0x1a0);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000002,(ulong)s_plglist);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&local_20);
    atomic = (Atomic *)0x0;
  }
  else {
    numAllocated = numAllocated + 1;
    Object::init((Object *)_e,(EVP_PKEY_CTX *)0x1);
    *(code **)((long)_e + 0x20) = atomicSync;
    *(undefined8 *)((long)_e + 0x28) = 0;
    V3d::set((V3d *)((long)_e + 0x30),0.0,0.0,0.0);
    *(undefined4 *)((long)_e + 0x3c) = 0;
    V3d::set((V3d *)((long)_e + 0x40),0.0,0.0,0.0);
    *(undefined4 *)((long)_e + 0x4c) = 0;
    ctx = (EVP_PKEY_CTX *)0x0;
    setFrame((Atomic *)_e,(Frame *)0x0);
    *(byte *)((long)_e + 3) = *(byte *)((long)_e + 3) | 1;
    *(undefined8 *)((long)_e + 0x50) = 0;
    LLLink::init((LLLink *)((long)_e + 0x58),ctx);
    *(undefined8 *)((long)_e + 0x68) = 0;
    *(code **)((long)_e + 0x70) = defaultRenderCB;
    *(undefined1 *)((long)_e + 2) = 5;
    *(undefined8 *)((long)_e + 0x78) = 0;
    *(undefined8 *)((long)_e + 0x80) = *(undefined8 *)((long)_e + 0x20);
    *(code **)((long)_e + 0x20) = worldAtomicSync;
    PluginList::construct((PluginList *)&s_plglist,(void *)_e);
    atomic = (Atomic *)_e;
  }
  return atomic;
}

Assistant:

Atomic*
Atomic::create(void)
{
	Atomic *atomic = (Atomic*)rwMalloc(s_plglist.size, MEMDUR_EVENT | ID_ATOMIC);
	if(atomic == nil){
		RWERROR((ERR_ALLOC, s_plglist.size));
		return nil;
	}
	numAllocated++;
	atomic->object.object.init(Atomic::ID, 0);
	atomic->object.syncCB = atomicSync;
	atomic->geometry = nil;
	atomic->boundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->boundingSphere.radius = 0.0f;
	atomic->worldBoundingSphere.center.set(0.0f, 0.0f, 0.0f);
	atomic->worldBoundingSphere.radius = 0.0f;
	atomic->setFrame(nil);
	atomic->object.object.privateFlags |= WORLDBOUNDDIRTY;
	atomic->clump = nil;
	atomic->inClump.init();
	atomic->pipeline = nil;
	atomic->renderCB = Atomic::defaultRenderCB;
	atomic->object.object.flags = Atomic::COLLISIONTEST | Atomic::RENDER;
	// TODO: interpolator

	// World extension
	atomic->world = nil;
	atomic->originalSync = atomic->object.syncCB;
	atomic->object.syncCB = worldAtomicSync;

	s_plglist.construct(atomic);
	return atomic;
}